

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

hwaddr x86_cpu_get_phys_page_attrs_debug_x86_64(CPUState *cs,vaddr addr,MemTxAttrs *attrs)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  TranslationBlock *pTVar4;
  uint64_t uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  *attrs = (MemTxAttrs)(*(uint *)(cs[1].tb_jmp_cache + 0x101) >> 0x12 & 2);
  if ((*(uint *)(cs[1].tb_jmp_cache + 0x101) >> 0x13 & 1) == 0) {
    uVar7 = (ulong)*(int *)(cs[1].tb_jmp_cache + 0x125);
  }
  else {
    uVar7 = 0xffffffffffffffff;
  }
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x903) & 0x80) == 0) {
    uVar8 = uVar7 & addr;
    iVar6 = 0x1000;
  }
  else if (((ulong)cs[1].tb_jmp_cache[0x124] & 0x20) == 0) {
    uVar2 = x86_ldl_phys_x86_64(cs,((ulong)cs[1].tb_jmp_cache[0x123] & 0xfffffffffffff000) +
                                   (addr >> 0x16 & 0x3ff) * 4 & uVar7);
    if ((uVar2 & 1) == 0) {
      return 0xffffffffffffffff;
    }
    if (((char)uVar2 < '\0') && (((ulong)cs[1].tb_jmp_cache[0x124] & 0x10) != 0)) {
      uVar8 = (ulong)(uVar2 & 0x1fe000) << 0x13 | (ulong)uVar2;
      iVar6 = 0x400000;
    }
    else {
      uVar2 = x86_ldl_phys_x86_64(cs,(ulong)((uint)uVar7 &
                                            ((uint)(addr >> 10) & 0xffc | uVar2 & 0xfffff000)));
      uVar8 = (ulong)uVar2;
      iVar6 = 0x1000;
      if ((uVar2 & 1) == 0) {
        return 0xffffffffffffffff;
      }
    }
    uVar8 = uVar8 & uVar7;
  }
  else {
    if ((*(uint *)(cs[1].tb_jmp_cache + 0x101) >> 0xe & 1) == 0) {
      uVar8 = x86_ldq_phys_x86_64(cs,((ulong)cs[1].tb_jmp_cache[0x123] & 0xffffffffffffffe0) +
                                     (addr >> 0x1e & 3) * 8 & uVar7);
      if ((uVar8 & 1) == 0) {
        return 0xffffffffffffffff;
      }
    }
    else {
      uVar3 = (uint)cs[1].tb_jmp_cache[0x124];
      if (((long)addr >> (((uVar3 >> 0xc & 1) != 0) * '\t' + 0x2fU & 0x3f)) - 1U <
          0xfffffffffffffffe) {
        return 0xffffffffffffffff;
      }
      pTVar4 = cs[1].tb_jmp_cache[0x123];
      uVar1 = (uint)(addr >> 0x20);
      if (((uVar3 >> 0xc & 1) != 0) &&
         (pTVar4 = (TranslationBlock *)
                   x86_ldq_phys_x86_64(cs,((ulong)(uVar1 >> 0xd & 0xff8) |
                                          (ulong)pTVar4 & 0xfffffffffffff000) & uVar7),
         ((ulong)pTVar4 & 1) == 0)) {
        return 0xffffffffffffffff;
      }
      uVar5 = x86_ldq_phys_x86_64(cs,((ulong)(uVar1 >> 4 & 0xff8) | (ulong)pTVar4 & 0xffffffffff000)
                                     & uVar7);
      if ((uVar5 & 1) == 0) {
        return 0xffffffffffffffff;
      }
      uVar8 = x86_ldq_phys_x86_64(cs,((ulong)((uint)(addr >> 0x1b) & 0xff8) |
                                     uVar5 & 0xffffffffff000) & uVar7);
      if ((uVar8 & 1) == 0) {
        return 0xffffffffffffffff;
      }
      iVar6 = 0x40000000;
      if ((char)uVar8 < '\0') goto LAB_004d38e6;
    }
    uVar8 = x86_ldq_phys_x86_64(cs,((ulong)((uint)(addr >> 0x12) & 0xff8) | uVar8 & 0xffffffffff000)
                                   & uVar7);
    if ((uVar8 & 1) == 0) {
      return 0xffffffffffffffff;
    }
    iVar6 = 0x200000;
    if (-1 < (char)uVar8) {
      uVar8 = x86_ldq_phys_x86_64(cs,((ulong)((uint)(addr >> 9) & 0xff8) | uVar8 & 0xffffffffff000)
                                     & uVar7);
      if ((uVar8 & 1) == 0) {
        return 0xffffffffffffffff;
      }
      iVar6 = 0x1000;
    }
  }
LAB_004d38e6:
  return (ulong)((uint)addr & iVar6 - 1U & 0xfffff000) | uVar8 & 0xffffffffff000 & (long)-iVar6;
}

Assistant:

hwaddr x86_cpu_get_phys_page_attrs_debug(CPUState *cs, vaddr addr,
                                         MemTxAttrs *attrs)
{
    X86CPU *cpu = X86_CPU(cs);
    CPUX86State *env = &cpu->env;
    target_ulong pde_addr, pte_addr;
    uint64_t pte;
    int32_t a20_mask;
    uint32_t page_offset;
    int page_size;

    *attrs = cpu_get_mem_attrs(env);

    a20_mask = x86_get_a20_mask(env);
    if (!(env->cr[0] & CR0_PG_MASK)) {
        pte = addr & a20_mask;
        page_size = 4096;
    } else if (env->cr[4] & CR4_PAE_MASK) {
        target_ulong pdpe_addr;
        uint64_t pde, pdpe;

#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            bool la57 = env->cr[4] & CR4_LA57_MASK;
            uint64_t pml5e_addr, pml5e;
            uint64_t pml4e_addr, pml4e;
            int32_t sext;

            /* test virtual address sign extension */
            sext = la57 ? (int64_t)addr >> 56 : (int64_t)addr >> 47;
            if (sext != 0 && sext != -1) {
                return -1;
            }

            if (la57) {
                pml5e_addr = ((env->cr[3] & ~0xfff) +
                        (((addr >> 48) & 0x1ff) << 3)) & a20_mask;
                pml5e = x86_ldq_phys(cs, pml5e_addr);
                if (!(pml5e & PG_PRESENT_MASK)) {
                    return -1;
                }
            } else {
                pml5e = env->cr[3];
            }

            pml4e_addr = ((pml5e & PG_ADDRESS_MASK) +
                    (((addr >> 39) & 0x1ff) << 3)) & a20_mask;
            pml4e = x86_ldq_phys(cs, pml4e_addr);
            if (!(pml4e & PG_PRESENT_MASK)) {
                return -1;
            }
            pdpe_addr = ((pml4e & PG_ADDRESS_MASK) +
                         (((addr >> 30) & 0x1ff) << 3)) & a20_mask;
            pdpe = x86_ldq_phys(cs, pdpe_addr);
            if (!(pdpe & PG_PRESENT_MASK)) {
                return -1;
            }
            if (pdpe & PG_PSE_MASK) {
                page_size = 1024 * 1024 * 1024;
                pte = pdpe;
                goto out;
            }

        } else
#endif
        {
            pdpe_addr = ((env->cr[3] & ~0x1f) + ((addr >> 27) & 0x18)) &
                a20_mask;
            pdpe = x86_ldq_phys(cs, pdpe_addr);
            if (!(pdpe & PG_PRESENT_MASK))
                return -1;
        }

        pde_addr = ((pdpe & PG_ADDRESS_MASK) +
                    (((addr >> 21) & 0x1ff) << 3)) & a20_mask;
        pde = x86_ldq_phys(cs, pde_addr);
        if (!(pde & PG_PRESENT_MASK)) {
            return -1;
        }
        if (pde & PG_PSE_MASK) {
            /* 2 MB page */
            page_size = 2048 * 1024;
            pte = pde;
        } else {
            /* 4 KB page */
            pte_addr = ((pde & PG_ADDRESS_MASK) +
                        (((addr >> 12) & 0x1ff) << 3)) & a20_mask;
            page_size = 4096;
            pte = x86_ldq_phys(cs, pte_addr);
        }
        if (!(pte & PG_PRESENT_MASK)) {
            return -1;
        }
    } else {
        uint32_t pde;

        /* page directory entry */
        pde_addr = ((env->cr[3] & ~0xfff) + ((addr >> 20) & 0xffc)) & a20_mask;
        pde = x86_ldl_phys(cs, pde_addr);
        if (!(pde & PG_PRESENT_MASK))
            return -1;
        if ((pde & PG_PSE_MASK) && (env->cr[4] & CR4_PSE_MASK)) {
            pte = pde | ((pde & 0x1fe000LL) << (32 - 13));
            page_size = 4096 * 1024;
        } else {
            /* page directory entry */
            pte_addr = ((pde & ~0xfff) + ((addr >> 10) & 0xffc)) & a20_mask;
            pte = x86_ldl_phys(cs, pte_addr);
            if (!(pte & PG_PRESENT_MASK)) {
                return -1;
            }
            page_size = 4096;
        }
        pte = pte & a20_mask;
    }

#ifdef TARGET_X86_64
out:
#endif
    pte &= PG_ADDRESS_MASK & ~(page_size - 1);
    page_offset = (addr & TARGET_PAGE_MASK) & (page_size - 1);
    return pte | page_offset;
}